

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

RefAST __thiscall antlr::ASTFactory::dupTree(ASTFactory *this,RefAST *t)

{
  AST *pAVar1;
  AST *pAVar2;
  ASTRefCount *in_RDX;
  int in_ESI;
  ASTFactory *in_RDI;
  RefAST *unaff_retaddr;
  ASTFactory *in_stack_00000008;
  RefAST *result;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffff88;
  undefined1 local_48 [8];
  undefined1 local_40 [39];
  undefined1 local_19;
  
  local_19 = 0;
  ASTRefCount<antlr::AST>::ASTRefCount((ASTRefCount<antlr::AST> *)in_RDX,in_stack_ffffffffffffff88);
  dup(in_RDI,in_ESI);
  ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_RDX);
  pAVar1 = ASTRefCount::operator_cast_to_AST_(in_RDX);
  if (pAVar1 != (AST *)0x0) {
    pAVar1 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDI);
    pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDX);
    (*pAVar2->_vptr_AST[0xd])(local_48);
    dupList(in_stack_00000008,unaff_retaddr);
    (*pAVar1->_vptr_AST[0x14])(pAVar1,local_40);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_RDX);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_RDX);
  }
  return (RefAST)(ASTRef *)in_RDI;
}

Assistant:

RefAST ASTFactory::dupTree(RefAST t)
{
	RefAST result = dup(t);		// make copy of root
	// copy all children of root.
	if( t )
		result->setFirstChild( dupList(t->getFirstChild()) );
	return result;
}